

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

vector<duckdb::LogicalType,_true> * duckdb::ArgMaxByTypes(void)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_f1;
  LogicalType local_f0 [24];
  LogicalType local_d8 [24];
  LogicalType local_c0 [24];
  LogicalType local_a8 [24];
  LogicalType local_90 [24];
  LogicalType local_78 [24];
  LogicalType local_60 [24];
  LogicalType local_48 [24];
  LogicalType local_30 [24];
  
  duckdb::LogicalType::LogicalType(local_f0,INTEGER);
  duckdb::LogicalType::LogicalType(local_d8,BIGINT);
  duckdb::LogicalType::LogicalType(local_c0,HUGEINT);
  duckdb::LogicalType::LogicalType(local_a8,DOUBLE);
  duckdb::LogicalType::LogicalType(local_90,VARCHAR);
  duckdb::LogicalType::LogicalType(local_78,DATE);
  duckdb::LogicalType::LogicalType(local_60,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_48,TIMESTAMP_TZ);
  duckdb::LogicalType::LogicalType(local_30,BLOB);
  __l._M_len = 9;
  __l._M_array = local_f0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (in_RDI,__l,&local_f1);
  lVar1 = 0xc0;
  do {
    duckdb::LogicalType::~LogicalType(local_f0 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return (vector<duckdb::LogicalType,_true> *)in_RDI;
}

Assistant:

static const vector<LogicalType> ArgMaxByTypes() {
	vector<LogicalType> types = {LogicalType::INTEGER,   LogicalType::BIGINT,       LogicalType::HUGEINT,
	                             LogicalType::DOUBLE,    LogicalType::VARCHAR,      LogicalType::DATE,
	                             LogicalType::TIMESTAMP, LogicalType::TIMESTAMP_TZ, LogicalType::BLOB};
	return types;
}